

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  
  if ((flags & 4U) != 0) {
    return GImGui->NavWindow != (ImGuiWindow *)0x0;
  }
  pIVar2 = GImGui->NavWindow;
  switch(flags & 3) {
  case 0:
    bVar3 = pIVar2 == GImGui->CurrentWindow;
    break;
  case 1:
    if (pIVar2 == (ImGuiWindow *)0x0) {
      return false;
    }
    pIVar1 = GImGui->CurrentWindow;
    if (pIVar2->RootWindow != pIVar1) {
      do {
        if (pIVar2 == pIVar1) {
          return pIVar2 == pIVar1;
        }
        pIVar2 = pIVar2->ParentWindow;
      } while (pIVar2 != (ImGuiWindow *)0x0);
      return false;
    }
    return true;
  case 3:
    if (pIVar2 == (ImGuiWindow *)0x0) {
      return false;
    }
    pIVar2 = pIVar2->RootWindow;
  case 2:
    bVar3 = pIVar2 == GImGui->CurrentWindow->RootWindow;
  }
  return bVar3;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiFocusedFlags_AnyWindow)
        return g.NavWindow != NULL;

    IM_ASSERT(g.CurrentWindow);     // Not inside a Begin()/End()
    switch (flags & (ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows))
    {
    case ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && g.NavWindow->RootWindow == g.CurrentWindow->RootWindow;
    case ImGuiFocusedFlags_RootWindow:
        return g.NavWindow == g.CurrentWindow->RootWindow;
    case ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && IsWindowChildOf(g.NavWindow, g.CurrentWindow);
    default:
        return g.NavWindow == g.CurrentWindow;
    }
}